

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

word * __thiscall capnp::_::PointerReader::getUnchecked(PointerReader *this)

{
  bool bVar1;
  Fault local_50;
  Fault f;
  SegmentReader **local_40;
  undefined1 local_38 [8];
  DebugComparison<capnp::_::SegmentReader_*const_&,_std::nullptr_t> _kjCondition;
  PointerReader *this_local;
  
  _kjCondition._32_8_ = this;
  local_40 = (SegmentReader **)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->segment);
  f.exception = (Exception *)0x0;
  kj::_::DebugExpression<capnp::_::SegmentReader*const&>::operator==
            ((DebugComparison<capnp::_::SegmentReader_*const_&,_std::nullptr_t> *)local_38,
             (DebugExpression<capnp::_::SegmentReader*const&> *)&local_40,&f.exception);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*const&,decltype(nullptr)>&,char_const(&)[58]>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xac2,FAILED,"segment == nullptr",
               "_kjCondition,\"getUncheckedPointer() only allowed on unchecked messages.\"",
               (DebugComparison<capnp::_::SegmentReader_*const_&,_std::nullptr_t> *)local_38,
               (char (*) [58])"getUncheckedPointer() only allowed on unchecked messages.");
    kj::_::Debug::Fault::fatal(&local_50);
  }
  return (word *)this->pointer;
}

Assistant:

const word* PointerReader::getUnchecked() const {
  KJ_REQUIRE(segment == nullptr, "getUncheckedPointer() only allowed on unchecked messages.");
  return reinterpret_cast<const word*>(pointer);
}